

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

bool __thiscall FileSystemUtils::Path::HasExtension(Path *this)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  size_t posaltseperator;
  size_t posseperator;
  size_t posdot;
  Path *this_local;
  
  cVar1 = (char)this;
  uVar2 = std::__cxx11::string::find_last_of(cVar1 + '\b',0x2e);
  if (uVar2 == 0xffffffffffffffff) {
    this_local._7_1_ = false;
  }
  else {
    uVar3 = std::__cxx11::string::find_last_of(cVar1 + '\b',0x2f);
    if ((uVar3 == 0xffffffffffffffff) || (uVar3 <= uVar2)) {
      uVar3 = std::__cxx11::string::find_last_of(cVar1 + '\b',0x5c);
      if ((uVar3 == 0xffffffffffffffff) || (uVar3 <= uVar2)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool Path::HasExtension() const
	{
		size_t posdot = m_string.find_last_of( '.' );
		if( posdot != std::string::npos )
		{
			size_t posseperator = m_string.find_last_of( seperator );
			if( posseperator != std::string::npos && posseperator > posdot )
			{
				return false; // the dot is for a directory such as ./ or ../ or the path is malformed
			}
			size_t posaltseperator = m_string.find_last_of( altseperator );
			if( posaltseperator != std::string::npos && posaltseperator > posdot )
			{
				return false; // the dot is for a directory such as ./ or ../ or the path is malformed
			}
			return true;
		}
		return false;
	}